

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar.hpp
# Opt level: O1

void __thiscall
cfgfile::tag_scalar_t<QString,_cfgfile::qstring_trait_t>::on_string
          (tag_scalar_t<QString,_cfgfile::qstring_trait_t> *this,
          parser_info_t<cfgfile::qstring_trait_t> *info,string_t *str)

{
  tag_t<cfgfile::qstring_trait_t> **pptVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  __normal_iterator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>_>
  _Var6;
  logic_error *this_00;
  QString value;
  string local_228;
  qstring_wrapper_t local_208;
  string local_1e8;
  string local_1c8;
  string_t local_1a8;
  string_t local_190;
  string_t local_178;
  string_t local_160;
  string_t local_148;
  string_t local_130;
  qstring_wrapper_t local_118;
  qstring_wrapper_t local_100;
  qstring_wrapper_t local_e8;
  qstring_wrapper_t local_d0;
  qstring_wrapper_t local_b8;
  qstring_wrapper_t local_a0;
  qstring_wrapper_t local_88;
  string local_70;
  string local_50;
  
  pptVar1 = (this->super_tag_t<cfgfile::qstring_trait_t>).m_child_tags.
            super__Vector_base<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  _Var6 = std::
          __find_if<__gnu_cxx::__normal_iterator<cfgfile::tag_t<cfgfile::qstring_trait_t>*const*,std::vector<cfgfile::tag_t<cfgfile::qstring_trait_t>*,std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>*>>>,__gnu_cxx::__ops::_Iter_pred<cfgfile::tag_t<cfgfile::qstring_trait_t>::is_any_child_defined()const::_lambda(cfgfile::tag_t<cfgfile::qstring_trait_t>*)_1_>>
                    ((this->super_tag_t<cfgfile::qstring_trait_t>).m_child_tags.
                     super__Vector_base<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,pptVar1);
  if (_Var6._M_current == pptVar1) {
    local_228._M_dataplus._M_p = (pointer)(str->m_str).d.d;
    local_228._M_string_length = (size_type)(str->m_str).d.ptr;
    local_228.field_2._M_allocated_capacity = (str->m_str).d.size;
    if ((QArrayData *)local_228._M_dataplus._M_p != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((QArrayData *)local_228._M_dataplus._M_p)->ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((QArrayData *)local_228._M_dataplus._M_p)->ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QString::append((QString *)&this->m_value);
    (this->super_tag_t<cfgfile::qstring_trait_t>).m_is_defined = true;
    if ((QArrayData *)local_228._M_dataplus._M_p != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_228._M_dataplus._M_p = *(int *)local_228._M_dataplus._M_p + -1;
      UNLOCK();
      if (*(int *)local_228._M_dataplus._M_p == 0) {
        QArrayData::deallocate((QArrayData *)local_228._M_dataplus._M_p,2,8);
      }
    }
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x28);
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"Value \"","");
  qstring_trait_t::from_ascii(&local_130,&local_228);
  operator+(&local_118,&local_130,str);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"\" for tag \"","");
  qstring_trait_t::from_ascii(&local_148,&local_50);
  operator+(&local_100,&local_118,&local_148);
  operator+(&local_e8,&local_100,&(this->super_tag_t<cfgfile::qstring_trait_t>).m_name);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"\" must be defined before any child tag. In file \"","");
  qstring_trait_t::from_ascii(&local_160,&local_70);
  operator+(&local_d0,&local_e8,&local_160);
  operator+(&local_b8,&local_d0,&info->m_file_name);
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"\" on line ","");
  qstring_trait_t::from_ascii(&local_178,&local_1c8);
  operator+(&local_a0,&local_b8,&local_178);
  qstring_trait_t::to_string(&local_190,info->m_line_number);
  operator+(&local_88,&local_a0,&local_190);
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,".","");
  qstring_trait_t::from_ascii(&local_1a8,&local_1e8);
  operator+(&local_208,&local_88,&local_1a8);
  std::logic_error::logic_error(this_00,"Please use desc() method of the exception.");
  *(undefined ***)this_00 = &PTR__exception_t_00147670;
  *(undefined8 *)(this_00 + 0x10) = 0;
  *(undefined8 *)(this_00 + 0x18) = 0;
  *(undefined8 *)(this_00 + 0x20) = 0;
  pcVar2 = *(char16_t **)(this_00 + 0x18);
  uVar4 = local_208.m_str.d.d._0_4_;
  uVar5 = local_208.m_str.d.d._4_4_;
  local_208.m_str.d.d = (Data *)0x0;
  *(undefined4 *)(this_00 + 0x10) = uVar4;
  *(undefined4 *)(this_00 + 0x14) = uVar5;
  *(undefined4 *)(this_00 + 0x18) = local_208.m_str.d.ptr._0_4_;
  *(undefined4 *)(this_00 + 0x1c) = local_208.m_str.d.ptr._4_4_;
  qVar3 = *(qsizetype *)(this_00 + 0x20);
  *(qsizetype *)(this_00 + 0x20) = local_208.m_str.d.size;
  local_208.m_str.d.ptr = pcVar2;
  local_208.m_str.d.size = qVar3;
  __cxa_throw(this_00,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
              exception_t<cfgfile::qstring_trait_t>::~exception_t);
}

Assistant:

void on_string( const parser_info_t< Trait > & info,
		const typename Trait::string_t & str ) override
	{
		if( this->is_any_child_defined() )
			throw exception_t< Trait >(
				Trait::from_ascii( "Value \"" ) + str +
				Trait::from_ascii( "\" for tag \"" ) + this->name() +
				Trait::from_ascii( "\" must be defined before any "
					"child tag. In file \"" ) +
				info.file_name() + Trait::from_ascii( "\" on line " ) +
				Trait::to_string( info.line_number() ) +
				Trait::from_ascii( "." ) );

		const QString value = format_t< QString, Trait >::from_string( info, str );

		m_value.append( value );

		this->set_defined();
	}